

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void re2c::output_types(ostream *o,uint32_t ind,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *types)

{
  ostream *poVar1;
  opt_t *poVar2;
  uint32_t extraout_EDX;
  uint32_t ind_00;
  uint32_t extraout_EDX_00;
  uint uVar3;
  undefined4 in_register_00000034;
  string local_50;
  
  indent_abi_cxx11_(&local_50,(re2c *)CONCAT44(in_register_00000034,ind),(uint32_t)types);
  poVar1 = std::operator<<(o,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"enum ");
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  poVar1 = std::operator<<(poVar1,(string *)&poVar2->yycondtype);
  std::operator<<(poVar1," {\n");
  std::__cxx11::string::~string((string *)&local_50);
  ind_00 = extraout_EDX;
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)(types->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(types->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    indent_abi_cxx11_(&local_50,(re2c *)(ulong)(ind + 1),ind_00);
    poVar1 = std::operator<<(o,(string *)&local_50);
    poVar2 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    poVar1 = std::operator<<(poVar1,(string *)&poVar2->condEnumPrefix);
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((types->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar3));
    std::operator<<(poVar1,",\n");
    std::__cxx11::string::~string((string *)&local_50);
    ind_00 = extraout_EDX_00;
  }
  indent_abi_cxx11_(&local_50,(re2c *)(ulong)ind,ind_00);
  poVar1 = std::operator<<(o,(string *)&local_50);
  std::operator<<(poVar1,"};\n");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void output_types (std::ostream & o, uint32_t ind, const std::vector<std::string> & types)
{
	o << indent (ind++) << "enum " << opts->yycondtype << " {\n";
	for (unsigned int i = 0; i < types.size (); ++i)
	{
		o << indent (ind) << opts->condEnumPrefix << types[i] << ",\n";
	}
	o << indent (--ind) << "};\n";
}